

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O2

int Sbl_ManCreateCnf(Sbl_Man_t *p)

{
  sat_solver *psVar1;
  Vec_Int_t *pVVar2;
  lit *begin;
  int *piVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int Entry;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  word wVar11;
  int pLits [2];
  ulong local_50;
  word *local_48;
  word *local_40;
  long local_38;
  
  local_40 = p->vCutsN1->pArray;
  local_48 = p->vCutsN2->pArray;
  iVar5 = p->FirstVar;
  iVar4 = sat_solver_nvars(p->pSat);
  if (iVar5 != iVar4) {
    __assert_fail("p->FirstVar == sat_solver_nvars(p->pSat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x356,"int Sbl_ManCreateCnf(Sbl_Man_t *)");
  }
  psVar1 = p->pSat;
  iVar5 = sat_solver_nvars(psVar1);
  sat_solver_setnvars(psVar1,iVar5 + p->vCutsI1->nSize);
  iVar5 = 0;
  while( true ) {
    if (p->vAnds->nSize <= iVar5) {
      psVar1 = p->pSat;
      piVar3 = p->vPolar->pArray;
      uVar6 = p->vPolar->nSize;
      for (lVar9 = 0; lVar9 < psVar1->size; lVar9 = lVar9 + 1) {
        psVar1->polarity[lVar9] = '\0';
      }
      uVar8 = 0;
      uVar10 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar10 = uVar8;
      }
      for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        psVar1->polarity[piVar3[uVar8]] = '\x01';
      }
      return 1;
    }
    uVar6 = Vec_IntEntry(p->vCutsStart,p->vLeaves->nSize + iVar5);
    local_50 = (ulong)uVar6;
    iVar4 = Vec_IntEntry(p->vCutsNum,p->vLeaves->nSize + iVar5);
    iVar7 = iVar4 + uVar6 + -1;
    pVVar2 = p->vLits;
    pVVar2->nSize = 0;
    iVar4 = Abc_Var2Lit(iVar5,1);
    Vec_IntPush(pVVar2,iVar4);
    uVar10 = local_50 & 0xffffffff;
    while (iVar4 = (int)uVar10, iVar4 < iVar7) {
      pVVar2 = p->vLits;
      Entry = Abc_Var2Lit(p->FirstVar + iVar4,0);
      Vec_IntPush(pVVar2,Entry);
      uVar10 = (ulong)(iVar4 + 1);
    }
    begin = p->vLits->pArray;
    iVar4 = sat_solver_addclause(p->pSat,begin,begin + p->vLits->nSize);
    if (iVar4 == 0) break;
    local_38 = (long)iVar7;
    uVar10 = (ulong)(int)local_50;
    while ((long)uVar10 < local_38) {
      wVar11 = local_40[uVar10];
      uVar8 = local_48[uVar10];
      pLits[0] = Abc_Var2Lit(p->FirstVar + (int)uVar10,1);
      pLits[1] = Abc_Var2Lit(iVar5,0);
      iVar4 = sat_solver_addclause(p->pSat,pLits,(lit *)&local_50);
      if (iVar4 == 0) {
        __assert_fail("value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x373,"int Sbl_ManCreateCnf(Sbl_Man_t *)");
      }
      iVar4 = 0;
      local_50 = uVar10;
      for (; wVar11 != 0; wVar11 = wVar11 >> 1) {
        if ((wVar11 & 1) != 0) {
          pLits[1] = Abc_Var2Lit(iVar4,0);
          iVar7 = sat_solver_addclause(p->pSat,pLits,(lit *)&local_50);
          if (iVar7 == 0) {
            __assert_fail("value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                          ,0x37c,"int Sbl_ManCreateCnf(Sbl_Man_t *)");
          }
        }
        iVar4 = iVar4 + 1;
      }
      iVar4 = 0x40;
      for (; uVar8 != 0; uVar8 = uVar8 >> 1) {
        if ((uVar8 & 1) != 0) {
          pLits[1] = Abc_Var2Lit(iVar4,0);
          iVar7 = sat_solver_addclause(p->pSat,pLits,(lit *)&local_50);
          if (iVar7 == 0) {
            __assert_fail("value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                          ,0x385,"int Sbl_ManCreateCnf(Sbl_Man_t *)");
          }
        }
        iVar4 = iVar4 + 1;
      }
      uVar10 = local_50 + 1;
    }
    iVar5 = iVar5 + 1;
  }
  __assert_fail("value",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                ,0x368,"int Sbl_ManCreateCnf(Sbl_Man_t *)");
}

Assistant:

int Sbl_ManCreateCnf( Sbl_Man_t * p )
{
    int i, k, c, pLits[2], value;
    word * pCutsN1 = Vec_WrdArray(p->vCutsN1);
    word * pCutsN2 = Vec_WrdArray(p->vCutsN2);
    assert( p->FirstVar == sat_solver_nvars(p->pSat) );
    sat_solver_setnvars( p->pSat, sat_solver_nvars(p->pSat) + Vec_WrdSize(p->vCutsI1) );
    //printf( "\n" );
    for ( i = 0; i < Vec_IntSize(p->vAnds); i++ )
    {
        int Start0 = Vec_IntEntry( p->vCutsStart, Vec_IntSize(p->vLeaves) + i );
        int Limit0 = Start0 + Vec_IntEntry( p->vCutsNum, Vec_IntSize(p->vLeaves) + i ) - 1;
        // add main clause
        Vec_IntClear( p->vLits );
        Vec_IntPush( p->vLits, Abc_Var2Lit(i, 1) );
        //printf( "Node %d implies cuts: ", i );
        for ( k = Start0; k < Limit0; k++ )
        {
            Vec_IntPush( p->vLits, Abc_Var2Lit(p->FirstVar+k, 0) );
            //printf( "%d ", p->FirstVar+k );
        }
        //printf( "\n" );
        value = sat_solver_addclause( p->pSat, Vec_IntArray(p->vLits), Vec_IntLimit(p->vLits)  );
        assert( value );
        // binary clauses
        for ( k = Start0; k < Limit0; k++ )
        {
            word Cut1 = pCutsN1[k];
            word Cut2 = pCutsN2[k];
            //printf( "Cut %d implies root node %d.\n", p->FirstVar+k, i );
            // root clause
            pLits[0] = Abc_Var2Lit( p->FirstVar+k, 1 );
            pLits[1] = Abc_Var2Lit( i, 0 );
            value = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
            assert( value );
            // fanin clauses
            for ( c = 0; c < 64 && Cut1; c++, Cut1 >>= 1 )
            {
                if ( (Cut1 & 1) == 0 )
                    continue;
                //printf( "Cut %d implies fanin %d.\n", p->FirstVar+k, c );
                pLits[1] = Abc_Var2Lit( c, 0 );
                value = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
                assert( value );
            }
            for ( c = 0; c < 64 && Cut2; c++, Cut2 >>= 1 )
            {
                if ( (Cut2 & 1) == 0 )
                    continue;
                //printf( "Cut %d implies fanin %d.\n", p->FirstVar+k, c );
                pLits[1] = Abc_Var2Lit( c+64, 0 );
                value = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
                assert( value );
            }
        }
    }
    sat_solver_set_polarity( p->pSat, Vec_IntArray(p->vPolar), Vec_IntSize(p->vPolar) );
    return 1;
}